

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rust_field_type.cc
# Opt level: O3

RustFieldType google::protobuf::compiler::rust::GetRustFieldType(Type type)

{
  undefined8 extraout_RAX;
  int in_EDI;
  Type local_1c;
  LogMessage local_18 [16];
  
  if (in_EDI - 1U < 0x12) {
    return *(RustFieldType *)(&DAT_004877e4 + (ulong)(in_EDI - 1U) * 4);
  }
  absl::lts_20240722::log_internal::LogMessage::LogMessage
            (local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/rust/rust_field_type.cc"
             ,0x30);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_18,0x14,"Unknown field type: ");
  absl::lts_20240722::log_internal::LogMessage::
  operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(local_18,&local_1c);
  GetRustFieldType();
  absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_18);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

RustFieldType GetRustFieldType(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_BOOL:
      return RustFieldType::BOOL;
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SFIXED32:
      return RustFieldType::INT32;
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED64:
      return RustFieldType::INT64;
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32:
      return RustFieldType::UINT32;
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64:
      return RustFieldType::UINT64;
    case FieldDescriptor::TYPE_FLOAT:
      return RustFieldType::FLOAT;
    case FieldDescriptor::TYPE_DOUBLE:
      return RustFieldType::DOUBLE;
    case FieldDescriptor::TYPE_BYTES:
      return RustFieldType::BYTES;
    case FieldDescriptor::TYPE_STRING:
      return RustFieldType::STRING;
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return RustFieldType::MESSAGE;
    case FieldDescriptor::TYPE_ENUM:
      return RustFieldType::ENUM;
  }
  ABSL_LOG(ERROR) << "Unknown field type: " << type;
  internal::Unreachable();
}